

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

Header * __thiscall Imf_3_4::Context::header(Context *this,int partidx)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  element_type *pp_Var6;
  ostream *poVar7;
  char *pcVar8;
  ArgExc *pAVar9;
  reference this_00;
  pointer pAVar10;
  LogicExc *this_01;
  int in_EDX;
  Header *in_RDI;
  stringstream _iex_throw_s_2;
  unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_> attr;
  MemAttrStream mas;
  int s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  svec;
  exr_attr_chlist_entry_t *curc;
  int c;
  ChannelList *chans;
  stringstream _iex_throw_s_1;
  int32_t idx;
  stringstream _iex_throw_s;
  exr_attribute_t *cur;
  int32_t attrcnt;
  Header *hdr;
  undefined4 in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff0fc;
  int in_stack_fffffffffffff100;
  Packing in_stack_fffffffffffff104;
  uint in_stack_fffffffffffff108;
  uint in_stack_fffffffffffff10c;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff110;
  V2f *in_stack_fffffffffffff118;
  Chromaticities *in_stack_fffffffffffff120;
  allocator_type *in_stack_fffffffffffff128;
  float *in_stack_fffffffffffff130;
  double (*in_stack_fffffffffffff138) [4] [4];
  PreviewRgba *in_stack_fffffffffffff140;
  type in_stack_fffffffffffff148;
  OpaqueAttribute *in_stack_fffffffffffff150;
  V2f *in_stack_fffffffffffff158;
  float in_stack_fffffffffffff164;
  undefined8 in_stack_fffffffffffff168;
  undefined7 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  Context *in_stack_fffffffffffff2a0;
  char *in_stack_fffffffffffff2e0;
  Channel *in_stack_fffffffffffff3a0;
  char *in_stack_fffffffffffff3a8;
  ChannelList *in_stack_fffffffffffff3b0;
  stringstream local_c18 [16];
  ostream local_c08 [440];
  OpaqueAttribute local_a50;
  uint local_a04;
  allocator local_9c9;
  string local_9c8 [36];
  int local_9a4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9a0 [3];
  Rational local_948 [5];
  Attribute *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6e8;
  Header *in_stack_fffffffffffff6f0;
  Vec2<float> local_8e8;
  Vec2<float> local_8e0;
  Vec2<float> local_8d8;
  Vec2<float> local_8d0 [98];
  TileDescription local_5c0 [2];
  Channel local_598;
  long local_588;
  int local_57c;
  ChannelList *local_578;
  uint local_56c;
  uint local_554;
  uint local_53c;
  allocator local_521;
  string local_520 [132];
  Context local_49c [8];
  char local_410 [184];
  stringstream local_358 [16];
  ostream local_348 [380];
  int local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [392];
  undefined8 *local_30;
  int local_24;
  Vec2<float> local_20;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  Imath_3_2::Vec2<float>::Vec2(&local_20,0.0,0.0);
  Header::Header((Header *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
                 (int)((ulong)in_stack_fffffffffffff168 >> 0x20),(int)in_stack_fffffffffffff168,
                 in_stack_fffffffffffff164,in_stack_fffffffffffff158,
                 (float)((ulong)in_stack_fffffffffffff150 >> 0x20),
                 (LineOrder)in_stack_fffffffffffff150,
                 (Compression)((ulong)in_stack_fffffffffffff148 >> 0x20));
  local_24 = 0;
  local_30 = (undefined8 *)0x0;
  pp_Var6 = std::
            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
  iVar4 = exr_get_attribute_count(*pp_Var6,local_14,&local_24);
  if (iVar4 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c8);
    poVar7 = std::operator<<(local_1b8,"Unable to get attribute for part ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_14);
    poVar7 = std::operator<<(poVar7," in file \'");
    pcVar8 = fileName(in_stack_fffffffffffff2a0);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7,"\'");
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar9,local_1c8);
    __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_1cc = 0;
  while( true ) {
    if (local_24 <= local_1cc) {
      return in_RDI;
    }
    pp_Var6 = std::
              __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
    iVar4 = exr_get_attribute_by_index(*pp_Var6,local_14,0,local_1cc,&local_30);
    if (iVar4 != 0) break;
    switch(*(undefined4 *)((long)local_30 + 0x14)) {
    case 0:
    case 0x1f:
    default:
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_c18);
      poVar7 = std::operator<<(local_c08,"Unknown attribute \'");
      poVar7 = std::operator<<(poVar7,(char *)*local_30);
      poVar7 = std::operator<<(poVar7,"\' of type \'");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)((long)local_30 + 0x14));
      std::operator<<(poVar7,"\', conversion to legacy header not yet implemented");
      this_01 = (LogicExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::LogicExc::LogicExc(this_01,local_c18);
      __cxa_throw(this_01,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
    case 1:
      Imath_3_2::Vec2<int>::Vec2<exr_attr_v2i_t,_0>
                ((Vec2<int> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2i_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Imath_3_2::Vec2<int>::Vec2<exr_attr_v2i_t,_0>
                ((Vec2<int> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2i_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
                ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffff110,
                 (Vec2<int> *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108),
                 (Vec2<int> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Box<Imath_3_2::Vec2<int>_> *)
                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)0x1939a5);
      break;
    case 2:
      Imath_3_2::Vec2<float>::Vec2<exr_attr_v2f_t,_0>
                ((Vec2<float> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2f_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Imath_3_2::Vec2<float>::Vec2<exr_attr_v2f_t,_0>
                ((Vec2<float> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2f_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Imath_3_2::Box<Imath_3_2::Vec2<float>_>::Box
                ((Box<Imath_3_2::Vec2<float>_> *)in_stack_fffffffffffff110,
                 (Vec2<float> *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108),
                 (Vec2<float> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Box<Imath_3_2::Vec2<float>_> *)
                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)0x193a89);
      break;
    case 3:
      local_578 = Header::channels((Header *)0x194139);
      for (local_57c = 0; local_57c < *(int *)local_30[3]; local_57c = local_57c + 1) {
        local_588 = *(long *)(local_30[3] + 8) + (long)local_57c * 0x20;
        Channel::Channel(&local_598,*(PixelType *)(local_588 + 0x10),*(int *)(local_588 + 0x18),
                         *(int *)(local_588 + 0x1c),*(char *)(local_588 + 0x14) != '\0');
        ChannelList::insert(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8,
                            in_stack_fffffffffffff3a0);
      }
      break;
    case 4:
      Imath_3_2::Vec2<float>::Vec2(local_8d0,*(float *)local_30[3],((float *)local_30[3])[1]);
      Imath_3_2::Vec2<float>::Vec2
                (&local_8d8,*(float *)(local_30[3] + 8),*(float *)(local_30[3] + 0xc));
      Imath_3_2::Vec2<float>::Vec2
                (&local_8e0,*(float *)(local_30[3] + 0x10),*(float *)(local_30[3] + 0x14));
      Imath_3_2::Vec2<float>::Vec2
                (&local_8e8,*(float *)(local_30[3] + 0x18),*(float *)(local_30[3] + 0x1c));
      Chromaticities::Chromaticities
                (in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                 (V2f *)in_stack_fffffffffffff110,
                 (V2f *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108),
                 (V2f *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Chromaticities> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Chromaticities *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Chromaticities> *)0x194780);
      break;
    case 5:
      local_53c = (uint)*(byte *)(local_30 + 3);
      TypedAttribute<Imf_3_4::Compression>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Compression> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Compression *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::Compression>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Compression> *)0x193fe9);
      break;
    case 6:
      TypedAttribute<double>::TypedAttribute
                ((TypedAttribute<double> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (double *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<double>::~TypedAttribute((TypedAttribute<double> *)0x193844);
      break;
    case 7:
      local_554 = (uint)*(byte *)(local_30 + 3);
      TypedAttribute<Imf_3_4::Envmap>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Envmap> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Envmap *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::Envmap>::~TypedAttribute((TypedAttribute<Imf_3_4::Envmap> *)0x194075);
      break;
    case 8:
      TypedAttribute<float>::TypedAttribute
                ((TypedAttribute<float> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (float *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x1938c1);
      break;
    case 9:
      std::allocator<float>::allocator((allocator<float> *)0x194313);
      std::vector<float,std::allocator<float>>::vector<float_const*,void>
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff140,
                 (float *)in_stack_fffffffffffff138,in_stack_fffffffffffff130,
                 in_stack_fffffffffffff128);
      TypedAttribute<std::vector<float,_std::allocator<float>_>_>::TypedAttribute
                ((TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffff110,
                 (vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<std::vector<float,_std::allocator<float>_>_>::~TypedAttribute
                ((TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff110);
      std::allocator<float>::~allocator((allocator<float> *)0x194397);
      break;
    case 10:
      TypedAttribute<int>::TypedAttribute
                ((TypedAttribute<int> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)0x1937c7);
      break;
    case 0xb:
      in_stack_fffffffffffff0f8 = *(undefined4 *)(local_30[3] + 0x14);
      in_stack_fffffffffffff100 = *(int *)(local_30[3] + 0x18);
      KeyCode::KeyCode((KeyCode *)in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
                       in_stack_fffffffffffff108,in_stack_fffffffffffff104,in_stack_fffffffffffff100
                       ,in_stack_fffffffffffff0fc,(int)in_stack_fffffffffffff120,
                       (int)in_stack_fffffffffffff128);
      TypedAttribute<Imf_3_4::KeyCode>::TypedAttribute
                ((TypedAttribute<Imf_3_4::KeyCode> *)in_stack_fffffffffffff110,
                 (KeyCode *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::KeyCode>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::KeyCode> *)0x194834);
      break;
    case 0xc:
      local_56c = (uint)*(byte *)(local_30 + 3);
      TypedAttribute<Imf_3_4::LineOrder>::TypedAttribute
                ((TypedAttribute<Imf_3_4::LineOrder> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (LineOrder *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::LineOrder>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::LineOrder> *)0x194101);
      break;
    case 0xd:
      Imath_3_2::Matrix33<float>::Matrix33<float[3][3],_0>
                ((Matrix33<float> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (float (*) [3] [3])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<float>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Matrix33<float> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Matrix33<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<float>_> *)0x194471);
      break;
    case 0xe:
      Imath_3_2::Matrix33<double>::Matrix33<double[3][3],_0>
                ((Matrix33<double> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (double (*) [3] [3])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Matrix33<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<double>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Matrix33<double> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Matrix33<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<double>_> *)0x194505);
      break;
    case 0xf:
      Imath_3_2::Matrix44<float>::Matrix44<float[4][4],_0>
                ((Matrix44<float> *)in_stack_fffffffffffff140,
                 (float (*) [4] [4])in_stack_fffffffffffff138);
      TypedAttribute<Imath_3_2::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<float>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Matrix44<float> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Matrix44<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<float>_> *)0x194599);
      break;
    case 0x10:
      Imath_3_2::Matrix44<double>::Matrix44<double[4][4],_0>
                ((Matrix44<double> *)in_stack_fffffffffffff140,in_stack_fffffffffffff138);
      TypedAttribute<Imath_3_2::Matrix44<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<double>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Matrix44<double> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Matrix44<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<double>_> *)0x19462d);
      break;
    case 0x11:
      PreviewImage::PreviewImage
                ((PreviewImage *)in_stack_fffffffffffff150,
                 (uint)((ulong)in_stack_fffffffffffff148 >> 0x20),(uint)in_stack_fffffffffffff148,
                 in_stack_fffffffffffff140);
      TypedAttribute<Imf_3_4::PreviewImage>::TypedAttribute
                ((TypedAttribute<Imf_3_4::PreviewImage> *)in_stack_fffffffffffff110,
                 (PreviewImage *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::PreviewImage>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::PreviewImage> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      PreviewImage::~PreviewImage
                ((PreviewImage *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      break;
    case 0x12:
      Rational::Rational(local_948,*(int *)local_30[3],((int *)local_30[3])[1]);
      TypedAttribute<Imf_3_4::Rational>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Rational> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Rational *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::Rational>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Rational> *)0x1948cd);
      break;
    case 0x13:
      pcVar8 = *(char **)((int *)local_30[3] + 2);
      iVar4 = *(int *)local_30[3];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_520,pcVar8,(long)iVar4,&local_521);
      TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::TypedAttribute(in_stack_fffffffffffff110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~TypedAttribute((TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      std::__cxx11::string::~string(local_520);
      std::allocator<char>::~allocator((allocator<char> *)&local_521);
      break;
    case 0x14:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x194a75);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff120,(size_type)in_stack_fffffffffffff118);
      for (local_9a4 = 0; local_9a4 < *(int *)local_30[3]; local_9a4 = local_9a4 + 1) {
        pcVar8 = *(char **)(*(long *)(local_30[3] + 8) + 8 + (long)local_9a4 * 0x10);
        iVar4 = *(int *)(*(long *)(local_30[3] + 8) + (long)local_9a4 * 0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_9c8,pcVar8,(long)iVar4,&local_9c9);
        this_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_9a0,(long)local_9a4);
        std::__cxx11::string::operator=((string *)this_00,local_9c8);
        std::__cxx11::string::~string(local_9c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
      }
      TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff110,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff110);
      break;
    case 0x15:
      puVar2 = (uint *)local_30[3];
      TileDescription::TileDescription
                (local_5c0,*puVar2,puVar2[1],(byte)puVar2[2] & 0xf,
                 (uint)(byte)((byte)puVar2[2] >> 4));
      TypedAttribute<Imf_3_4::TileDescription>::TypedAttribute
                ((TypedAttribute<Imf_3_4::TileDescription> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (TileDescription *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::TileDescription>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::TileDescription> *)0x1942a1);
      break;
    case 0x16:
      TimeCode::TimeCode((TimeCode *)in_stack_fffffffffffff110,in_stack_fffffffffffff10c,
                         in_stack_fffffffffffff108,in_stack_fffffffffffff104);
      TypedAttribute<Imf_3_4::TimeCode>::TypedAttribute
                ((TypedAttribute<Imf_3_4::TimeCode> *)in_stack_fffffffffffff110,
                 (TimeCode *)CONCAT44(in_stack_fffffffffffff10c,in_stack_fffffffffffff108));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::TimeCode>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::TimeCode> *)0x194968);
      break;
    case 0x17:
      in_stack_fffffffffffff2e0 = local_410;
      Imath_3_2::Vec2<int>::Vec2<exr_attr_v2i_t,_0>
                ((Vec2<int> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2i_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Vec2<int>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<int>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Vec2<int> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Vec2<int>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<int>_> *)0x193b23);
      break;
    case 0x18:
      Imath_3_2::Vec2<float>::Vec2<exr_attr_v2f_t,_0>
                ((Vec2<float> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2f_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Vec2<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<float>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Vec2<float> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Vec2<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<float>_> *)0x193bbd);
      break;
    case 0x19:
      Imath_3_2::Vec2<double>::Vec2<exr_attr_v2d_t,_0>
                ((Vec2<double> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v2d_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Vec2<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<double>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Vec2<double> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Vec2<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<double>_> *)0x193c57);
      break;
    case 0x1a:
      Imath_3_2::Vec3<int>::Vec3<exr_attr_v3i_t,_0>
                ((Vec3<int> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v3i_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Vec3<int>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<int>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Vec3<int> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Vec3<int>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<int>_> *)0x193cf1);
      break;
    case 0x1b:
      in_stack_fffffffffffff2a0 = local_49c;
      Imath_3_2::Vec3<float>::Vec3<exr_attr_v3f_t,_0>
                ((Vec3<float> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v3f_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Vec3<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<float>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Vec3<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<float>_> *)0x193d8b);
      break;
    case 0x1c:
      Imath_3_2::Vec3<double>::Vec3<exr_attr_v3d_t,_0>
                ((Vec3<double> *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (exr_attr_v3d_t *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      TypedAttribute<Imath_3_2::Vec3<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<double>_> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (Vec3<double> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imath_3_2::Vec3<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<double>_> *)0x193e25);
      break;
    case 0x1d:
      local_a04 = (uint)*(byte *)(local_30 + 3);
      TypedAttribute<Imf_3_4::DeepImageState>::TypedAttribute
                ((TypedAttribute<Imf_3_4::DeepImageState> *)
                 CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                 (DeepImageState *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      TypedAttribute<Imf_3_4::DeepImageState>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::DeepImageState> *)0x194cba);
      break;
    case 0x1e:
      bVar3 = Attribute::knownType((char *)in_stack_fffffffffffff130);
      if (bVar3) {
        anon_unknown_75::MemAttrStream::MemAttrStream
                  ((MemAttrStream *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                   (exr_attr_opaquedata_t *)
                   CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        std::unique_ptr<Imf_3_4::Attribute,std::default_delete<Imf_3_4::Attribute>>::
        unique_ptr<std::default_delete<Imf_3_4::Attribute>,void>
                  ((unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_> *)
                   CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
        Attribute::newAttribute(in_stack_fffffffffffff2e0);
        in_stack_fffffffffffff150 = &local_a50;
        std::unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_>::reset
                  ((unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_> *)
                   CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100),
                   (pointer)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        pAVar10 = std::unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_>::
                  operator->((unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_>
                              *)0x194d6a);
        uVar1 = *(uint *)local_30[3];
        uVar5 = version(in_stack_fffffffffffff2a0);
        (*pAVar10->_vptr_Attribute[5])(pAVar10,&local_a50._typeName,(ulong)uVar1,(ulong)uVar5);
        in_stack_fffffffffffff140 = (PreviewRgba *)*local_30;
        in_stack_fffffffffffff148 =
             std::unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_>::
             operator*((unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_> *)
                       CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100));
        Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
                      );
        std::unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_>::~unique_ptr
                  ((unique_ptr<Imf_3_4::Attribute,_std::default_delete<Imf_3_4::Attribute>_> *)
                   in_stack_fffffffffffff110);
        anon_unknown_75::MemAttrStream::~MemAttrStream((MemAttrStream *)0x194e0b);
      }
      else {
        in_stack_fffffffffffff138 = (double (*) [4] [4])*local_30;
        OpaqueAttribute::OpaqueAttribute
                  (in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148,
                   (long)in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        Header::insert(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0
                      );
        OpaqueAttribute::~OpaqueAttribute
                  ((OpaqueAttribute *)CONCAT44(in_stack_fffffffffffff104,in_stack_fffffffffffff100))
        ;
      }
    }
    local_1cc = local_1cc + 1;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_358);
  poVar7 = std::operator<<(local_348,"Unable to get attribute index ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1cc);
  poVar7 = std::operator<<(poVar7," for part ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_14);
  poVar7 = std::operator<<(poVar7," in file \'");
  pcVar8 = fileName(in_stack_fffffffffffff2a0);
  poVar7 = std::operator<<(poVar7,pcVar8);
  std::operator<<(poVar7,"\'");
  pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar9,local_358);
  __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

Header
Context::header (int partidx) const
{
    Header                 hdr;
    int32_t                attrcnt = 0;
    const exr_attribute_t* cur     = nullptr;

    if (EXR_ERR_SUCCESS != exr_get_attribute_count (*_ctxt, partidx, &attrcnt))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get attribute for part " << partidx << " in file '"
                                                << fileName () << "'");
    }

    for (int32_t idx = 0; idx < attrcnt; ++idx)
    {
        if (EXR_ERR_SUCCESS !=
            exr_get_attribute_by_index (
                *_ctxt, partidx, EXR_ATTR_LIST_FILE_ORDER, idx, &cur))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Unable to get attribute index " << idx << " for part "
                                                 << partidx << " in file '"
                                                 << fileName () << "'");
        }

        switch (cur->type)
        {
            case EXR_ATTR_INT:
                hdr.insert (cur->name, IntAttribute (cur->i));
                break;
            case EXR_ATTR_DOUBLE:
                hdr.insert (cur->name, DoubleAttribute (cur->d));
                break;
            case EXR_ATTR_FLOAT:
                hdr.insert (cur->name, FloatAttribute (cur->f));
                break;

            case EXR_ATTR_BOX2I:
                hdr.insert (
                    cur->name,
                    Box2iAttribute (IMATH_NAMESPACE::Box2i (
                        IMATH_NAMESPACE::V2i (cur->box2i->min),
                        IMATH_NAMESPACE::V2i (cur->box2i->max))));
                break;
            case EXR_ATTR_BOX2F:
                hdr.insert (
                    cur->name,
                    Box2fAttribute (IMATH_NAMESPACE::Box2f (
                        IMATH_NAMESPACE::V2f (cur->box2f->min),
                        IMATH_NAMESPACE::V2f (cur->box2f->max))));
                break;

            case EXR_ATTR_V2I:
                hdr.insert (
                    cur->name,
                    V2iAttribute (IMATH_NAMESPACE::V2i (*(cur->v2i))));
                break;
            case EXR_ATTR_V2F:
                hdr.insert (
                    cur->name,
                    V2fAttribute (IMATH_NAMESPACE::V2f (*(cur->v2f))));
                break;
            case EXR_ATTR_V2D:
                hdr.insert (
                    cur->name,
                    V2dAttribute (IMATH_NAMESPACE::V2d (*(cur->v2d))));
                break;
            case EXR_ATTR_V3I:
                hdr.insert (
                    cur->name,
                    V3iAttribute (IMATH_NAMESPACE::V3i (*(cur->v3i))));
                break;
            case EXR_ATTR_V3F:
                hdr.insert (
                    cur->name,
                    V3fAttribute (IMATH_NAMESPACE::V3f (*(cur->v3f))));
                break;
            case EXR_ATTR_V3D:
                hdr.insert (
                    cur->name,
                    V3dAttribute (IMATH_NAMESPACE::V3d (*(cur->v3d))));
                break;

            case EXR_ATTR_STRING:
                hdr.insert (
                    cur->name,
                    StringAttribute (
                        std::string (cur->string->str, cur->string->length)));
                break;

            case EXR_ATTR_COMPRESSION:
                hdr.insert (
                    cur->name, CompressionAttribute (Compression (cur->uc)));
                break;
            case EXR_ATTR_ENVMAP:
                hdr.insert (cur->name, EnvmapAttribute (Envmap (cur->uc)));
                break;
            case EXR_ATTR_LINEORDER:
                hdr.insert (
                    cur->name, LineOrderAttribute (LineOrder (cur->uc)));
                break;

            case EXR_ATTR_CHLIST: {
                ChannelList& chans = hdr.channels ();

                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    const exr_attr_chlist_entry_t& curc =
                        cur->chlist->entries[c];
                    chans.insert (
                        curc.name.str,
                        Channel (
                            PixelType (curc.pixel_type),
                            curc.x_sampling,
                            curc.y_sampling,
                            curc.p_linear != 0));
                }
                break;
            }

            case EXR_ATTR_TILEDESC:
                hdr.insert (
                    cur->name, TileDescriptionAttribute (
                        TileDescription (
                            cur->tiledesc->x_size,
                            cur->tiledesc->y_size,
                            (LevelMode)(EXR_GET_TILE_LEVEL_MODE (*cur->tiledesc)),
                            (LevelRoundingMode)(EXR_GET_TILE_ROUND_MODE (*cur->tiledesc)))));
                break;

            case EXR_ATTR_FLOAT_VECTOR:
                hdr.insert (
                    cur->name, FloatVectorAttribute (
                        FloatVector (
                            cur->floatvector->arr,
                            cur->floatvector->arr + cur->floatvector->length)));
                break;

            case EXR_ATTR_M33F:
                hdr.insert (
                    cur->name, M33fAttribute (
                        IMATH_NAMESPACE::M33f (
                            *reinterpret_cast<float (*)[3][3]> (cur->m33f->m))));
                break;
            case EXR_ATTR_M33D:
                hdr.insert (
                    cur->name, M33dAttribute (
                        IMATH_NAMESPACE::M33d (
                            *reinterpret_cast<double (*)[3][3]> (cur->m33d->m))));
                break;
            case EXR_ATTR_M44F:
                hdr.insert (
                    cur->name, M44fAttribute (
                        IMATH_NAMESPACE::M44f (
                            *reinterpret_cast<float (*)[4][4]> (cur->m44f->m))));
                break;
            case EXR_ATTR_M44D:
                hdr.insert (
                    cur->name, M44dAttribute (
                        IMATH_NAMESPACE::M44d (
                            *reinterpret_cast<double (*)[4][4]> (cur->m44d->m))));
                break;

            case EXR_ATTR_CHROMATICITIES:
                hdr.insert (
                    cur->name, ChromaticitiesAttribute (
                        Chromaticities (
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->red_x,
                                cur->chromaticities->red_y),
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->green_x,
                                cur->chromaticities->green_y),
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->blue_x,
                                cur->chromaticities->blue_y),
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->white_x,
                                cur->chromaticities->white_y))));
                break;
            case EXR_ATTR_KEYCODE:
                hdr.insert (
                    cur->name, KeyCodeAttribute (
                        KeyCode (
                            cur->keycode->film_mfc_code,
                            cur->keycode->film_type,
                            cur->keycode->prefix,
                            cur->keycode->count,
                            cur->keycode->perf_offset,
                            cur->keycode->perfs_per_frame,
                            cur->keycode->perfs_per_count)));
                break;
            case EXR_ATTR_RATIONAL:
                hdr.insert (
                    cur->name, RationalAttribute (
                        Rational (
                            cur->rational->num,
                            cur->rational->denom)));
                break;
            case EXR_ATTR_TIMECODE:
                hdr.insert (
                    cur->name, TimeCodeAttribute (
                        TimeCode (
                            cur->timecode->time_and_flags,
                            cur->timecode->user_data)));
                break;
            case EXR_ATTR_PREVIEW:
                hdr.insert (
                    cur->name, PreviewImageAttribute (
                        PreviewImage (
                            cur->preview->width,
                            cur->preview->height,
                            reinterpret_cast<const PreviewRgba*> (cur->preview->rgba))));
                break;
            case EXR_ATTR_STRING_VECTOR:
            {
                std::vector<std::string> svec;
                svec.resize (cur->stringvector->n_strings);
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    svec[s] = std::string (
                        cur->stringvector->strings[s].str,
                        cur->stringvector->strings[s].length);
                }
                hdr.insert (
                    cur->name, StringVectorAttribute (svec));
                break;
            }

            case EXR_ATTR_DEEP_IMAGE_STATE:
                hdr.insert (
                    cur->name, DeepImageStateAttribute (DeepImageState (cur->uc)));
                break;

            case EXR_ATTR_OPAQUE:
                if (Attribute::knownType (cur->type_name))
                {
                    MemAttrStream mas {cur->opaque};

                    std::unique_ptr<Attribute> attr;
                    attr.reset (Attribute::newAttribute (cur->type_name));

                    attr->readValueFrom (mas, cur->opaque->size, version ());
                    // TODO: can we avoid a double copy?
                    hdr.insert (cur->name, *attr);
                }
                else
                {
                    hdr.insert (
                        cur->name, OpaqueAttribute (
                            cur->type_name,
                            cur->opaque->size,
                            cur->opaque->packed_data));
                }
                break;

            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default: {
                THROW (IEX_NAMESPACE::LogicExc,
                       "Unknown attribute '"
                       << cur->name
                       << "' of type '"
                       << cur->type << "', conversion to legacy header not yet implemented");
            }
        }
    }

    return hdr;
}